

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

Aig_Man_t * Aig_ManSplit(Aig_Man_t *p,int nVars,int fVerbose)

{
  Aig_Man_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_01;
  DdManager *dd_00;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *vCofs_00;
  abctime aVar6;
  abctime clk;
  int i;
  Vec_Ptr_t *vCofs;
  Vec_Ptr_t *vSubs;
  Vec_Ptr_t *vSupp;
  DdManager *dd;
  DdNode *bFunc;
  Aig_Obj_t *pNode;
  Aig_Man_t *pRes;
  int fVerbose_local;
  int nVars_local;
  Aig_Man_t *p_local;
  
  pRes._0_4_ = fVerbose;
  pRes._4_4_ = nVars;
  _fVerbose_local = p;
  aVar4 = Abc_Clock();
  iVar1 = Saig_ManPoNum(_fVerbose_local);
  p_00 = _fVerbose_local;
  if (iVar1 == 1) {
    if (pRes._4_4_ < 1) {
      printf("The number of cofactoring variables should be a positive number.\n");
      p_local = (Aig_Man_t *)0x0;
    }
    else if (pRes._4_4_ < 0x11) {
      pAVar5 = Aig_ManCo(_fVerbose_local,0);
      pAVar5 = Aig_ObjFanin0(pAVar5);
      p_01 = Aig_Support(p_00,pAVar5);
      iVar1 = Vec_PtrSize(p_01);
      if (iVar1 == 0) {
        printf("Property output function is a constant.\n");
        Vec_PtrFree(p_01);
        p_local = (Aig_Man_t *)0x0;
      }
      else {
        dd_00 = Aig_ManBuildPoBdd(_fVerbose_local,(DdNode **)&dd);
        if ((int)pRes != 0) {
          uVar2 = Vec_PtrSize(p_01);
          uVar3 = Cudd_DagSize(&dd->sentinel);
          printf("Support =%5d.  BDD size =%6d.  ",(ulong)uVar2,(ulong)uVar3);
        }
        p_02 = Aig_ManVecRandSubset(p_01,pRes._4_4_);
        for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p_02), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
        {
          bFunc = (DdNode *)Vec_PtrEntry(p_02,clk._4_4_);
          Vec_PtrWriteEntry(p_02,clk._4_4_,*(void **)(bFunc + 1));
        }
        vCofs_00 = Aig_ManCofactorBdds(_fVerbose_local,p_02,dd_00,&dd->sentinel);
        pNode = (Aig_Obj_t *)Aig_ManConvertBddsToAigs(_fVerbose_local,dd_00,vCofs_00);
        Vec_PtrFree(p_01);
        Vec_PtrFree(p_02);
        if ((int)pRes != 0) {
          uVar2 = Saig_ManPoNum((Aig_Man_t *)pNode);
          uVar3 = Vec_PtrSize(vCofs_00);
          printf("Created %d cofactors (out of %d).  ",(ulong)uVar2,(ulong)uVar3);
        }
        if ((int)pRes != 0) {
          aVar6 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar6 - aVar4);
        }
        Cudd_RecursiveDeref(dd_00,&dd->sentinel);
        for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(vCofs_00), clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          dd = (DdManager *)Vec_PtrEntry(vCofs_00,clk._4_4_);
          Cudd_RecursiveDeref(dd_00,(DdNode *)dd);
        }
        Vec_PtrFree(vCofs_00);
        Extra_StopManager(dd_00);
        p_local = (Aig_Man_t *)pNode;
      }
    }
    else {
      printf("The number of cofactoring variables should be less than 17.\n");
      p_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    printf("Currently works only for one primary output.\n");
    p_local = (Aig_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Aig_Man_t * Aig_ManSplit( Aig_Man_t * p, int nVars, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pNode;
    DdNode * bFunc;
    DdManager * dd;
    Vec_Ptr_t * vSupp, * vSubs, * vCofs;
    int i;
    abctime clk = Abc_Clock();
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "Currently works only for one primary output.\n" );
        return NULL;
    }
    if ( nVars < 1 )
    {
        printf( "The number of cofactoring variables should be a positive number.\n" );
        return NULL;
    }
    if ( nVars > 16 )
    {
        printf( "The number of cofactoring variables should be less than 17.\n" );
        return NULL;
    }
    vSupp = Aig_Support( p, Aig_ObjFanin0(Aig_ManCo(p,0)) );
    if ( Vec_PtrSize(vSupp) == 0 )
    {
        printf( "Property output function is a constant.\n" );
        Vec_PtrFree( vSupp );
        return NULL;
    }
    dd    = Aig_ManBuildPoBdd( p, &bFunc ); // bFunc is referenced
    if ( fVerbose )
        printf( "Support =%5d.  BDD size =%6d.  ", Vec_PtrSize(vSupp), Cudd_DagSize(bFunc) );
    vSubs = Aig_ManVecRandSubset( vSupp, nVars );
    // replace nodes by their BDD variables
    Vec_PtrForEachEntry( Aig_Obj_t *, vSubs, pNode, i )
        Vec_PtrWriteEntry( vSubs, i, pNode->pData );
    // derive cofactors and functions
    vCofs = Aig_ManCofactorBdds( p, vSubs, dd, bFunc );
    pRes  = Aig_ManConvertBddsToAigs( p, dd, vCofs );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vSubs );
    if ( fVerbose )
        printf( "Created %d cofactors (out of %d).  ", Saig_ManPoNum(pRes), Vec_PtrSize(vCofs) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // dereference
    Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vCofs );
    Extra_StopManager( dd );
    return pRes;
}